

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

float incircleexact(float *pa,float *pb,float *pc,float *pd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float bc [4];
  float bd [4];
  float ac [4];
  float cd [4];
  float ab [4];
  float temp8 [8];
  float da [4];
  float dab [12];
  float cda [12];
  float abc [12];
  float det24y [24];
  float det24x [24];
  float bcd [12];
  float det48x [48];
  float cdet [96];
  float bdet [96];
  float adet [96];
  float det48y [48];
  float ddet [96];
  float deter [384];
  float cddet [192];
  float abdet [192];
  float local_15e8;
  float local_15e4;
  float local_15e0;
  float local_15dc;
  float local_15d8 [4];
  float local_15c8 [4];
  undefined1 local_15b8 [16];
  undefined1 local_15a8 [16];
  undefined1 local_1598 [16];
  float local_1588;
  float local_1584;
  float local_1580;
  float local_157c;
  float local_1578;
  float local_1574;
  float local_1570;
  float local_156c;
  float local_1568 [8];
  float local_1548;
  float local_1544;
  float local_1540;
  float local_153c;
  float local_1538 [12];
  float local_1508 [12];
  float local_14d8 [12];
  float local_14a8 [24];
  float local_1448 [24];
  float local_13e8 [12];
  float local_13b8 [48];
  float local_12f8 [96];
  float local_1178 [96];
  float local_ff8 [96];
  float local_e78 [48];
  float local_db8 [95];
  float afStack_c3c [385];
  float local_638 [192];
  float local_338 [194];
  
  fVar1 = *pa;
  fVar2 = pa[1];
  fVar3 = *pb;
  fVar4 = pb[1];
  fVar11 = fVar1 * fVar4;
  fVar17 = fVar1 * splitter - (fVar1 * splitter - fVar1);
  fVar14 = fVar1 - fVar17;
  fVar18 = fVar4 * splitter - (fVar4 * splitter - fVar4);
  fVar20 = fVar4 - fVar18;
  fVar13 = fVar14 * fVar20 - (((fVar11 - fVar17 * fVar18) - fVar14 * fVar18) - fVar17 * fVar20);
  fVar12 = fVar3 * fVar2;
  fVar21 = splitter * fVar3 - (splitter * fVar3 - fVar3);
  fVar30 = splitter * fVar2 - (splitter * fVar2 - fVar2);
  fVar27 = fVar3 - fVar21;
  fVar28 = fVar2 - fVar30;
  fVar15 = fVar27 * fVar28 - (((fVar12 - fVar21 * fVar30) - fVar27 * fVar30) - fVar21 * fVar28);
  fVar22 = fVar13 - fVar15;
  local_1578 = (fVar13 - (fVar22 + (fVar13 - fVar22))) + ((fVar13 - fVar22) - fVar15);
  fVar13 = fVar11 + fVar22;
  fVar11 = (fVar11 - (fVar13 - (fVar13 - fVar11))) + (fVar22 - (fVar13 - fVar11));
  fVar15 = fVar11 - fVar12;
  local_1574 = (fVar11 - (fVar15 + (fVar11 - fVar15))) + ((fVar11 - fVar15) - fVar12);
  local_156c = fVar13 + fVar15;
  local_1570 = (fVar13 - (local_156c - (local_156c - fVar13))) + (fVar15 - (local_156c - fVar13));
  fVar11 = pc[1];
  fVar31 = splitter * fVar11 - (splitter * fVar11 - fVar11);
  fVar13 = fVar3 * fVar11;
  local_1598 = ZEXT416((uint)fVar27);
  fVar29 = fVar11 - fVar31;
  fVar22 = fVar27 * fVar29 - (((fVar13 - fVar21 * fVar31) - fVar27 * fVar31) - fVar21 * fVar29);
  fVar12 = *pc;
  fVar33 = splitter * fVar12 - (splitter * fVar12 - fVar12);
  fVar15 = fVar4 * fVar12;
  local_15a8 = ZEXT416((uint)fVar18);
  fVar25 = fVar12 - fVar33;
  local_15b8 = ZEXT416((uint)fVar20);
  fVar16 = fVar25 * fVar20 - (((fVar15 - fVar33 * fVar18) - fVar25 * fVar18) - fVar33 * fVar20);
  fVar23 = fVar22 - fVar16;
  local_15e8 = (fVar22 - (fVar23 + (fVar22 - fVar23))) + ((fVar22 - fVar23) - fVar16);
  fVar22 = fVar13 + fVar23;
  fVar13 = (fVar13 - (fVar22 - (fVar22 - fVar13))) + (fVar23 - (fVar22 - fVar13));
  fVar16 = fVar13 - fVar15;
  local_15e4 = (fVar13 - (fVar16 + (fVar13 - fVar16))) + ((fVar13 - fVar16) - fVar15);
  local_15dc = fVar22 + fVar16;
  local_15e0 = (fVar22 - (local_15dc - (local_15dc - fVar22))) + (fVar16 - (local_15dc - fVar22));
  fVar13 = pd[1];
  fVar34 = splitter * fVar13 - (splitter * fVar13 - fVar13);
  fVar22 = fVar12 * fVar13;
  fVar32 = fVar13 - fVar34;
  fVar23 = fVar25 * fVar32 - (((fVar22 - fVar33 * fVar34) - fVar25 * fVar34) - fVar33 * fVar32);
  fVar15 = *pd;
  fVar26 = splitter * fVar15 - (splitter * fVar15 - fVar15);
  fVar19 = fVar11 * fVar15;
  fVar24 = fVar15 - fVar26;
  fVar35 = fVar24 * fVar29 - (((fVar19 - fVar26 * fVar31) - fVar24 * fVar31) - fVar26 * fVar29);
  fVar16 = fVar23 - fVar35;
  local_1588 = (fVar23 - (fVar16 + (fVar23 - fVar16))) + ((fVar23 - fVar16) - fVar35);
  fVar23 = fVar22 + fVar16;
  fVar22 = (fVar22 - (fVar23 - (fVar23 - fVar22))) + (fVar16 - (fVar23 - fVar22));
  fVar16 = fVar22 - fVar19;
  local_1584 = (fVar22 - (fVar16 + (fVar22 - fVar16))) + ((fVar22 - fVar16) - fVar19);
  local_157c = fVar23 + fVar16;
  local_1580 = (fVar23 - (local_157c - (local_157c - fVar23))) + (fVar16 - (local_157c - fVar23));
  fVar19 = fVar2 * fVar15;
  fVar35 = fVar24 * fVar28 - (((fVar19 - fVar26 * fVar30) - fVar24 * fVar30) - fVar26 * fVar28);
  fVar23 = fVar1 * fVar13;
  fVar22 = fVar14 * fVar32 - (((fVar23 - fVar17 * fVar34) - fVar14 * fVar34) - fVar17 * fVar32);
  fVar16 = fVar35 - fVar22;
  local_1548 = (fVar35 - (fVar16 + (fVar35 - fVar16))) + ((fVar35 - fVar16) - fVar22);
  fVar22 = fVar19 + fVar16;
  fVar19 = (fVar19 - (fVar22 - (fVar22 - fVar19))) + (fVar16 - (fVar22 - fVar19));
  fVar16 = fVar19 - fVar23;
  local_1544 = (fVar19 - (fVar16 + (fVar19 - fVar16))) + ((fVar19 - fVar16) - fVar23);
  local_153c = fVar22 + fVar16;
  local_1540 = (fVar22 - (local_153c - (local_153c - fVar22))) + (fVar16 - (local_153c - fVar22));
  fVar22 = fVar1 * fVar11;
  fVar19 = fVar29 * fVar14 - (((fVar22 - fVar17 * fVar31) - fVar31 * fVar14) - fVar17 * fVar29);
  fVar16 = fVar2 * fVar12;
  fVar23 = fVar25 * fVar28 - (((fVar16 - fVar33 * fVar30) - fVar30 * fVar25) - fVar33 * fVar28);
  fVar14 = fVar19 - fVar23;
  local_15c8[0] = (fVar19 - (fVar14 + (fVar19 - fVar14))) + ((fVar19 - fVar14) - fVar23);
  fVar23 = fVar22 + fVar14;
  fVar22 = (fVar22 - (fVar23 - (fVar23 - fVar22))) + (fVar14 - (fVar23 - fVar22));
  fVar14 = fVar22 - fVar16;
  local_15c8[1] = (fVar22 - (fVar14 + (fVar22 - fVar14))) + ((fVar22 - fVar14) - fVar16);
  local_15c8[3] = fVar23 + fVar14;
  local_15c8[2] =
       (fVar23 - (local_15c8[3] - (local_15c8[3] - fVar23))) + (fVar14 - (local_15c8[3] - fVar23));
  fVar22 = fVar3 * fVar13;
  fVar19 = fVar32 * fVar27 - (((fVar22 - fVar21 * fVar34) - fVar34 * fVar27) - fVar21 * fVar32);
  fVar16 = fVar4 * fVar15;
  fVar23 = fVar24 * fVar20 - (((fVar16 - fVar26 * fVar18) - fVar18 * fVar24) - fVar26 * fVar20);
  fVar14 = fVar19 - fVar23;
  local_15d8[0] = (fVar19 - (fVar14 + (fVar19 - fVar14))) + ((fVar19 - fVar14) - fVar23);
  fVar23 = fVar22 + fVar14;
  fVar22 = (fVar22 - (fVar23 - (fVar23 - fVar22))) + (fVar14 - (fVar23 - fVar22));
  fVar14 = fVar22 - fVar16;
  local_15d8[1] = (fVar22 - (fVar14 + (fVar22 - fVar14))) + ((fVar22 - fVar14) - fVar16);
  local_15d8[3] = fVar23 + fVar14;
  local_15d8[2] =
       (fVar23 - (local_15d8[3] - (local_15d8[3] - fVar23))) + (fVar14 - (local_15d8[3] - fVar23));
  iVar5 = fast_expansion_sum_zeroelim(4,&local_1588,4,&local_1548,local_1568);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_1568,4,local_15c8,local_1508);
  iVar6 = fast_expansion_sum_zeroelim(4,&local_1548,4,&local_1578,local_1568);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_1568,4,local_15d8,local_1538);
  lVar10 = 0;
  do {
    local_15d8[lVar10] = -local_15d8[lVar10];
    local_15c8[lVar10] = -local_15c8[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  iVar7 = fast_expansion_sum_zeroelim(4,&local_1578,4,&local_15e8,local_1568);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_1568,4,local_15c8,local_14d8);
  iVar8 = fast_expansion_sum_zeroelim(4,&local_15e8,4,&local_1588,local_1568);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_1568,4,local_15d8,local_13e8);
  iVar9 = scale_expansion_zeroelim(iVar8,local_13e8,SUB84((double)fVar1,0),local_1448);
  iVar9 = scale_expansion_zeroelim(iVar9,local_1448,SUB84((double)fVar1,0),local_13b8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_13e8,SUB84((double)fVar2,0),local_14a8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_14a8,SUB84((double)fVar2,0),local_e78);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,local_13b8,iVar8,local_e78,local_ff8);
  iVar9 = scale_expansion_zeroelim(iVar5,local_1508,SUB84((double)fVar3,0),local_1448);
  iVar9 = scale_expansion_zeroelim(iVar9,local_1448,SUB84((double)-fVar3,0),local_13b8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_1508,SUB84((double)fVar4,0),local_14a8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_14a8,SUB84((double)-fVar4,0),local_e78);
  iVar5 = fast_expansion_sum_zeroelim(iVar9,local_13b8,iVar5,local_e78,local_1178);
  iVar9 = scale_expansion_zeroelim(iVar6,local_1538,SUB84((double)fVar12,0),local_1448);
  iVar9 = scale_expansion_zeroelim(iVar9,local_1448,SUB84((double)fVar12,0),local_13b8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_1538,SUB84((double)fVar11,0),local_14a8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_14a8,SUB84((double)fVar11,0),local_e78);
  iVar6 = fast_expansion_sum_zeroelim(iVar9,local_13b8,iVar6,local_e78,local_12f8);
  iVar9 = scale_expansion_zeroelim(iVar7,local_14d8,SUB84((double)fVar15,0),local_1448);
  iVar9 = scale_expansion_zeroelim(iVar9,local_1448,SUB84((double)-fVar15,0),local_13b8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_14d8,SUB84((double)fVar13,0),local_14a8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_14a8,SUB84((double)-fVar13,0),local_e78);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,local_13b8,iVar7,local_e78,local_db8);
  iVar5 = fast_expansion_sum_zeroelim(iVar8,local_ff8,iVar5,local_1178,local_338);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_12f8,iVar7,local_db8,local_638);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_338,iVar6,local_638,afStack_c3c + 1);
  return afStack_c3c[iVar5];
}

Assistant:

REAL incircleexact(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}